

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

void __thiscall
ON_Xform::Rotation(ON_Xform *this,ON_3dVector start_dir,ON_3dVector end_dir,
                  ON_3dPoint rotation_center)

{
  ON_3dVector axis_00;
  bool bVar1;
  double dVar2;
  double local_38;
  double sin_angle;
  ON_3dVector axis;
  double cos_angle;
  ON_Xform *this_local;
  
  dVar2 = ON_3dVector::Length(&start_dir);
  if (1.490116119385e-08 < ABS(dVar2 - 1.0)) {
    ON_3dVector::Unitize(&start_dir);
  }
  dVar2 = ON_3dVector::Length(&end_dir);
  if (1.490116119385e-08 < ABS(dVar2 - 1.0)) {
    ON_3dVector::Unitize(&end_dir);
  }
  axis.z = ON_3dVector::operator*(&start_dir,&end_dir);
  ON_CrossProduct((ON_3dVector *)&sin_angle,&start_dir,&end_dir);
  local_38 = ON_3dVector::Length((ON_3dVector *)&sin_angle);
  if (((local_38 == 0.0) && (!NAN(local_38))) ||
     (bVar1 = ON_3dVector::Unitize((ON_3dVector *)&sin_angle), !bVar1)) {
    ON_3dVector::PerpendicularTo((ON_3dVector *)&sin_angle,&start_dir);
    ON_3dVector::Unitize((ON_3dVector *)&sin_angle);
    local_38 = 0.0;
    axis.z = (double)(~-(ulong)(axis.z < 0.0) & 0x3ff0000000000000 |
                     (ulong)((uint)(-(ulong)(axis.z < 0.0) >> 0x20) & 0xbff00000) << 0x20);
  }
  axis_00.y = axis.x;
  axis_00.x = sin_angle;
  axis_00.z = axis.y;
  Rotation(this,local_38,axis.z,axis_00,rotation_center);
  return;
}

Assistant:

void ON_Xform::Rotation(
  ON_3dVector start_dir,
  ON_3dVector end_dir,
  ON_3dPoint rotation_center
  )
{
  if ( fabs(start_dir.Length()-1.0) > ON_SQRT_EPSILON )
    start_dir.Unitize();
  if ( fabs(end_dir.Length()-1.0) > ON_SQRT_EPSILON )
    end_dir.Unitize();
  double cos_angle = start_dir*end_dir;
  ON_3dVector axis = ON_CrossProduct(start_dir,end_dir);
  double sin_angle = axis.Length();
  if ( 0.0 == sin_angle || !axis.Unitize() )
  {
    axis.PerpendicularTo(start_dir);
    axis.Unitize();
    sin_angle = 0.0;
    cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0;
  }
  Rotation(sin_angle,cos_angle,axis,rotation_center);
}